

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O1

void __thiscall
cfd::core::Psbt::SetTxInUtxo
          (Psbt *this,uint32_t index,TxOutReference *txout,Script *redeem_script,
          vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *key_list)

{
  uint32_t vout;
  void *pvVar1;
  bool bVar2;
  int64_t iVar3;
  CfdException *pCVar4;
  long lVar5;
  undefined4 in_register_00000034;
  long lVar6;
  int ret;
  wally_tx_output *output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> script_val;
  Txid txid;
  Script script;
  Script new_redeem_script;
  int local_10c;
  undefined1 local_108 [8];
  int local_100;
  char *local_f8 [2];
  undefined8 local_e8;
  ulong local_e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d8;
  Txid local_c0;
  Script local_a0;
  Script local_68;
  
  (*this->_vptr_Psbt[2])(this,CONCAT44(in_register_00000034,index),0x8ff,"SetTxInUtxo");
  pvVar1 = this->wally_psbt_pointer_;
  lVar6 = *(long *)(*(long *)((long)pvVar1 + 8) + 8);
  lVar5 = (ulong)index * 0xd0;
  vout = *(uint32_t *)(lVar6 + 0x20 + lVar5);
  local_e0 = (ulong)index;
  ByteData::ByteData((ByteData *)&local_68,(uint8_t *)(lVar6 + lVar5),0x20);
  ByteData256::ByteData256((ByteData256 *)&local_a0,(ByteData *)&local_68);
  Txid::Txid(&local_c0,(ByteData256 *)&local_a0);
  if (local_a0._vptr_Script != (_func_int **)0x0) {
    operator_delete(local_a0._vptr_Script);
  }
  if (local_68._vptr_Script != (_func_int **)0x0) {
    operator_delete(local_68._vptr_Script);
  }
  Script::Script(&local_a0,&(txout->super_AbstractTxOutReference).locking_script_);
  Script::Script(&local_68,redeem_script);
  bVar2 = ValidatePsbtUtxo(&local_c0,vout,&local_a0,redeem_script,key_list,&local_68);
  if (bVar2) {
    local_e8 = 0;
    Script::GetData((ByteData *)local_108,&local_a0);
    ByteData::GetBytes(&local_d8,(ByteData *)local_108);
    if (local_108 != (undefined1  [8])0x0) {
      operator_delete((void *)local_108);
    }
    local_108 = (undefined1  [8])(txout->super_AbstractTxOutReference).value_.amount_;
    local_100 = CONCAT31(local_100._1_3_,(txout->super_AbstractTxOutReference).value_.ignore_check_)
    ;
    iVar3 = Amount::GetSatoshiValue((Amount *)local_108);
    local_10c = wally_tx_output_init_alloc
                          (iVar3,local_d8.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                           (long)local_d8.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_d8.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,&local_e8);
    if (local_10c == 0) {
      lVar6 = local_e0 * 0x110;
      local_10c = wally_psbt_input_set_witness_utxo(*(long *)((long)pvVar1 + 0x10) + lVar6,local_e8)
      ;
      wally_tx_output_free(local_e8);
      if (local_10c == 0) {
        SetPsbtTxInScriptAndKeyList
                  ((wally_psbt_input *)(lVar6 + *(long *)((long)pvVar1 + 0x10)),true,&local_68,
                   key_list,&local_a0);
        if (local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        Script::~Script(&local_68);
        Script::~Script(&local_a0);
        local_c0._vptr_Txid = (_func_int **)&PTR__Txid_0025aa88;
        if (local_c0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_c0.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        return;
      }
      local_108 = (undefined1  [8])0x21e190;
      local_100 = 0x91e;
      local_f8[0] = "SetTxInUtxo";
      logger::log<int&>((CfdSourceLocation *)local_108,kCfdLogLevelWarning,
                        "wally_psbt_input_set_witness_utxo NG[{}]",&local_10c);
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      local_108 = (undefined1  [8])local_f8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_108,"psbt add witness utxo error.","");
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_108);
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
    local_108 = (undefined1  [8])0x21e190;
    local_100 = 0x916;
    local_f8[0] = "SetTxInUtxo";
    logger::log<int&>((CfdSourceLocation *)local_108,kCfdLogLevelWarning,
                      "wally_tx_output_init_alloc NG[{}]",&local_10c);
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_108 = (undefined1  [8])local_f8;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_108,"psbt alloc output error.","");
    CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_108);
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_108 = (undefined1  [8])0x21e190;
  local_100 = 0x90c;
  local_f8[0] = "SetTxInUtxo";
  logger::log<>((CfdSourceLocation *)local_108,kCfdLogLevelWarning,
                "non witness output is not supported.");
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  local_108 = (undefined1  [8])local_f8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"psbt utxo type error.","");
  CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_108);
  __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void Psbt::SetTxInUtxo(
    uint32_t index, const TxOutReference &txout, const Script &redeem_script,
    const std::vector<KeyData> &key_list) {
  CheckTxInIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  uint8_t *txhash = psbt_pointer->tx->inputs[index].txhash;
  uint32_t vout = psbt_pointer->tx->inputs[index].index;
  Txid txid(ByteData256(
      ByteData(txhash, sizeof(psbt_pointer->tx->inputs[index].txhash))));

  auto script = txout.GetLockingScript();
  Script new_redeem_script = redeem_script;
  bool is_witness = ValidatePsbtUtxo(
      txid, vout, script, redeem_script, key_list, &new_redeem_script);
  if (!is_witness) {
    warn(CFD_LOG_SOURCE, "non witness output is not supported.");
    throw CfdException(kCfdIllegalArgumentError, "psbt utxo type error.");
  }

  struct wally_tx_output *output = nullptr;
  auto script_val = script.GetData().GetBytes();
  int ret = wally_tx_output_init_alloc(
      static_cast<uint64_t>(txout.GetValue().GetSatoshiValue()),
      script_val.data(), script_val.size(), &output);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_output_init_alloc NG[{}]", ret);
    throw CfdException(kCfdIllegalArgumentError, "psbt alloc output error.");
  }

  ret =
      wally_psbt_input_set_witness_utxo(&psbt_pointer->inputs[index], output);
  wally_tx_output_free(output);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_psbt_input_set_witness_utxo NG[{}]", ret);
    throw CfdException(
        kCfdIllegalArgumentError, "psbt add witness utxo error.");
  }

  SetPsbtTxInScriptAndKeyList(
      &psbt_pointer->inputs[index], is_witness, new_redeem_script, key_list,
      script);
}